

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# features.c
# Opt level: O0

void faup_features_find(faup_handler_t *fh,char *url,size_t url_len)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  faup_features_t *features;
  ushort **ppuVar5;
  long local_78;
  size_t special_char_after_colons_pos;
  size_t i;
  ssize_t buffer_pos;
  ssize_t current_pos;
  char host_is_ipv6;
  faup_last_slash_t last_slash_meaning;
  ssize_t whatever_len;
  char *url_o;
  long lStack_38;
  int last_slash_pos;
  size_t nb_slashes;
  char next_c;
  char c;
  faup_features_t *url_features;
  size_t url_len_local;
  char *url_local;
  faup_handler_t *fh_local;
  
  features = &(fh->faup).features;
  lStack_38 = 0;
  current_pos._4_4_ = 0;
  bVar1 = false;
  buffer_pos = 0;
  local_78 = -1;
  faup_features_init(features);
  for (special_char_after_colons_pos = 0; special_char_after_colons_pos < url_len;
      special_char_after_colons_pos = special_char_after_colons_pos + 1) {
    cVar2 = url[special_char_after_colons_pos];
    if (special_char_after_colons_pos + 1 < url_len) {
      nb_slashes._6_1_ = url[special_char_after_colons_pos + 1];
    }
    else {
      nb_slashes._6_1_ = '\0';
    }
    if (cVar2 == '/') {
      lStack_38 = lStack_38 + 1;
    }
    if ((!bVar1) || (cVar2 == ']')) {
      iVar3 = (int)buffer_pos;
      switch(cVar2) {
      case '#':
        if ((local_78 != buffer_pos) &&
           (iVar4 = faup_features_exist((fh->faup).features.fragment), iVar4 == 0)) {
          (fh->faup).features.fragment.pos = iVar3;
        }
        break;
      default:
        if (buffer_pos == 0) {
          (fh->faup).features.host.pos = 0;
        }
        iVar4 = faup_features_exist((fh->faup).features.host);
        if ((iVar4 == 0) &&
           (iVar4 = faup_features_exist((fh->faup).features.credential), iVar4 == 0)) {
          (fh->faup).features.host.pos = iVar3;
        }
        break;
      case '/':
        cVar2 = get_last_c(url,buffer_pos);
        if (cVar2 != '\\') {
          if ((lStack_38 == 1) && (cVar2 = get_last_c(url,buffer_pos), cVar2 == ':')) {
            if (current_pos._4_4_ < 2) {
              current_pos._4_4_ = 1;
              (fh->faup).features.hierarchical.pos = iVar3 + -1;
              cVar2 = get_last_c(url,buffer_pos - 1);
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)cVar2] & 0x400) != 0) {
                (fh->faup).features.scheme.pos = 0;
              }
              (fh->faup).features.host.pos = -1;
              (fh->faup).features.port.pos = -1;
            }
          }
          else {
            iVar4 = faup_features_exist((fh->faup).features.resource_path);
            if (iVar4 == 0) {
              iVar4 = faup_features_exist(features->scheme);
              if (iVar4 == 0) {
                iVar4 = faup_features_exist((fh->faup).features.hierarchical);
                if (iVar4 == 0) {
                  current_pos._4_4_ = 2;
                  (fh->faup).features.resource_path.pos = iVar3;
                }
              }
              else {
                iVar4 = faup_features_exist((fh->faup).features.host);
                if (iVar4 != 0) {
                  current_pos._4_4_ = 2;
                  (fh->faup).features.resource_path.pos = iVar3;
                }
              }
            }
          }
          iVar3 = faup_features_exist((fh->faup).features.host);
          if (iVar3 != 0) {
            current_pos._4_4_ = 2;
          }
        }
        break;
      case ':':
        iVar4 = faup_features_exist((fh->faup).features.port);
        if ((iVar4 == 0) && (current_pos._4_4_ < 2)) {
          ppuVar5 = __ctype_b_loc();
          if (((*ppuVar5)[(int)nb_slashes._6_1_] & 8) == 0) {
            if (nb_slashes._6_1_ == ':') {
              if ((fh->faup).features.host.pos < 0) {
                (fh->faup).features.host.pos = iVar3;
                bVar1 = true;
                (fh->faup).url_type = FAUP_URL_IPV6;
              }
            }
            else {
              local_78 = buffer_pos + 1;
            }
          }
          else {
            (fh->faup).features.port.pos = iVar3 + 1;
          }
        }
        break;
      case '?':
        if (local_78 != buffer_pos) {
          if (current_pos._4_4_ == 2) {
            iVar4 = faup_features_exist((fh->faup).features.query_string);
            if (iVar4 == 0) {
              (fh->faup).features.query_string.pos = iVar3;
            }
          }
          else if ((current_pos._4_4_ < 2) &&
                  (iVar4 = faup_features_exist((fh->faup).features.resource_path), iVar4 == 0)) {
            iVar4 = faup_features_exist(features->scheme);
            if (iVar4 == 0) {
              iVar4 = faup_features_exist((fh->faup).features.hierarchical);
              if (iVar4 == 0) {
                current_pos._4_4_ = 2;
                iVar4 = faup_features_exist((fh->faup).features.query_string);
                if (iVar4 == 0) {
                  (fh->faup).features.query_string.pos = iVar3;
                }
              }
            }
            else {
              iVar4 = faup_features_exist((fh->faup).features.host);
              if (iVar4 != 0) {
                current_pos._4_4_ = 2;
                iVar4 = faup_features_exist((fh->faup).features.query_string);
                if (iVar4 == 0) {
                  (fh->faup).features.query_string.pos = iVar3;
                }
              }
            }
          }
        }
        break;
      case '@':
        if ((((current_pos._4_4_ < 2) && (local_78 != buffer_pos)) &&
            (iVar4 = faup_features_exist((fh->faup).features.credential), iVar4 == 0)) &&
           (cVar2 = get_last_c(url,buffer_pos), cVar2 != '@')) {
          if ((current_pos._4_4_ == 1) || (current_pos._4_4_ == 0)) {
            (fh->faup).features.credential.pos = (fh->faup).features.host.pos;
            (fh->faup).features.host.pos = iVar3 + 1;
            (fh->faup).features.port.pos = -1;
          }
          else if (local_78 != (fh->faup).features.hierarchical.pos) {
            current_pos._4_4_ = 1;
            (fh->faup).features.credential.pos = (fh->faup).features.host.pos;
            (fh->faup).features.host.pos = iVar3 + 1;
            (fh->faup).features.port.pos = -1;
            (fh->faup).features.resource_path.pos = -1;
          }
        }
        break;
      case '[':
        if ((fh->faup).features.host.pos < 0) {
          (fh->faup).features.host.pos = iVar3;
          bVar1 = true;
        }
        break;
      case ']':
        bVar1 = false;
      }
    }
    buffer_pos = buffer_pos + 1;
  }
  return;
}

Assistant:

void faup_features_find(faup_handler_t *fh, const char *url, const size_t url_len)
{
	faup_features_t* url_features = &fh->faup.features;
	char c;
	char next_c;
	size_t nb_slashes = 0;
	//int char_counter[128];
	int last_slash_pos = 0;
	const char *url_o = url;	/* We keep the original pointer as we move it */
	ssize_t whatever_len = 0;

	faup_last_slash_t last_slash_meaning = FAUP_LAST_SLASH_NOTFOUND;
	char host_is_ipv6 = 0;

	ssize_t current_pos = 0;
	ssize_t buffer_pos = 0;
	size_t i;

	size_t special_char_after_colons_pos = -1;


	faup_features_init(url_features);

	for (i = 0; i < url_len; i++) {
		c = url[i];

		if ((i + 1) < url_len) {
			next_c = url[i+1];
		} else {
			next_c = '\0';
		}

		if (c == '/') {
			nb_slashes++;
		}

		/* printf("reading %c, bufferpos=%d\n", c, buffer_pos); */

		if (host_is_ipv6 && c != ']') {
			current_pos++;
		        continue;
		}

		switch(c) {
			case '/':
				// This is for URLs such as "http://test:\/test@example.com"
				if (get_last_c(url_o, current_pos) == '\\') {
					buffer_pos=-1;
					break;
				}
				/* If it is the first time we have a '/' and previous char is ':' */
				if ((nb_slashes == 1) && (get_last_c(url_o, current_pos) == ':')) {
					if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
						last_slash_meaning = FAUP_LAST_SLASH_HIERARCHICAL;
						url_features->hierarchical.pos = current_pos -1;
						c = get_last_c(url_o, current_pos - 1);
						if (isalpha(c)) {
							url_features->scheme.pos = 0;
						}
						url_features->host.pos = -1; /* So finally we don't start with a host */
						url_features->port.pos = -1; /* So the last ':' we've found was not for a port but for  */
					} /* if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) */
				} else {
					/* We now check for the resource path */
					if (!faup_features_exist(url_features->resource_path)) {
						if (!faup_features_exist(url_features->scheme)) {
							if (!faup_features_exist(url_features->hierarchical)) {
								/* This host has a '/' with no hierarchy */
								/* The seen '/' is not a hierarchy so it is something like foo/bar.html */
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								url_features->resource_path.pos = current_pos;
							}
						} else {
							if (faup_features_exist(url_features->host)) {
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								url_features->resource_path.pos = current_pos;
							}
						}
					}
				}

				last_slash_pos = current_pos;

				if (faup_features_exist(url_features->host)) {
					last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
				}

				buffer_pos=-1;
				break;
			case '@':
				if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
					if (special_char_after_colons_pos != current_pos) {
						if (!faup_features_exist(url_features->credential)) {
							if (get_last_c(url_o, current_pos) == '@') {
								break;
							}

							whatever_len = buffer_pos;
							if ((last_slash_meaning == FAUP_LAST_SLASH_HIERARCHICAL) || /* This '@' belongs to the authentication if http://foo:bar@host/blah */
									(last_slash_meaning == FAUP_LAST_SLASH_NOTFOUND)) {     /* This '@' belongs to the authentication if foo:bar@host/blah */
								url_features->credential.pos = url_features->host.pos; /* The credential starts where we thought it was a pos */
								url_features->host.pos = current_pos + 1;
								url_features->port.pos = -1; /* So the last ':' we've found was not for a port but for credential */
							} else {
								if (special_char_after_colons_pos != url_features->hierarchical.pos) {
									// That '/' belongs to the password after colons ':'
									last_slash_meaning = FAUP_LAST_SLASH_HIERARCHICAL;
									url_features->credential.pos = url_features->host.pos; 
									url_features->host.pos = current_pos + 1;
									url_features->port.pos = -1;
									url_features->resource_path.pos = -1;
								}
							}
						}
					}
				}
				buffer_pos=-1;
				break;
			case ':':
				/* We have three cases here:
				   - a ':' for the credential
				   - a ':' for the port number
				   - a ':' in the query request */
				if (!faup_features_exist(url_features->port)) {
					if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
						if (isalnum(next_c)) {
							// Skip a special char that may come after a port. Thus, this would not be a port.
							url_features->port.pos = current_pos + 1;
						} else {
						  if (next_c != ':') {
							special_char_after_colons_pos = current_pos + 1;
						  } else {
						    /* In this case we discovered a dot after the other. It it most likely an IPv6 address */
						    if (url_features->host.pos < 0) {
						      url_features->host.pos = current_pos;
						      host_is_ipv6 = 1;
						      fh->faup.url_type = FAUP_URL_IPV6;
						    }

						  }
						}
					}
				}

				buffer_pos=-1;

				break;
			case '?':
				/* printf("Current pos:%zd, special_char:%zd\n", current_pos, special_char_after_colons_pos); */
				if (special_char_after_colons_pos != current_pos) {
					if (last_slash_meaning == FAUP_LAST_SLASH_AFTER_DOMAIN) {
					  if (!faup_features_exist(url_features->query_string)) {
					    url_features->query_string.pos = current_pos;
					  }
					} else if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
					  /* printf("Before last slash after domain"); */
					  if (!faup_features_exist(url_features->resource_path)) {
						if (!faup_features_exist(url_features->scheme)) {
							if (!faup_features_exist(url_features->hierarchical)) {
								/* This host has a '/' with no hierarchy */
								/* The seen '/' is not a hierarchy so it is something like foo/bar.html */
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								if (!faup_features_exist(url_features->query_string)) {
								  url_features->query_string.pos = current_pos;
								}
							}
						} else {
							if (faup_features_exist(url_features->host)) {
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								if (!faup_features_exist(url_features->query_string)) {
								  url_features->query_string.pos = current_pos;
								}
							}
						}
					}

					}
					
				}

				buffer_pos=-1;
				break;
			case '#':
				if (special_char_after_colons_pos != current_pos) {
				  /* I was checking for FAUP_LAST_SLASH_AFTER_DOMAIN for a reason I ignore. I removed that check and all the tests are passing. \o/ */
				  /* if ((last_slash_meaning == FAUP_LAST_SLASH_AFTER_DOMAIN) && (!faup_features_exist(url_features->fragment))) { */
				  if (!faup_features_exist(url_features->fragment)) {
				    url_features->fragment.pos = current_pos;
				  }
				}

				buffer_pos=-1;
				break;
		    case '[': /* This can be an IPv6 URL, see RFC 2732*/
				if (url_features->host.pos < 0) {
				  url_features->host.pos = current_pos;
				  host_is_ipv6 = 1;
				}
			    break;
		    case ']':
			    host_is_ipv6 = 0; /* We stop handle the special IPv6 case*/
			    break;
			default:
				//fh->allocated_buf[buffer_pos] = c;
				if (current_pos == 0) {
					/* We assume we have a host to start. We shall turn it back to -1 if we have a scheme or hierachy */
					url_features->host.pos = 0;
				}
				/* We have a scheme, but no host nor no credential, then host is current_pos until we have a credential to remove it */
				if ((!faup_features_exist(url_features->host)) && 
						(!faup_features_exist(url_features->credential))) {
					url_features->host.pos = current_pos;

				}

				break;
		}

		buffer_pos++;
		current_pos++;
	}

		// faup_features_debug("features", &fh->faup.features);
}